

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTessellationUtil.hpp
# Opt level: O0

vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_> * __thiscall
vkt::tessellation::readInterleavedData<tcu::Vector<float,3>>
          (vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
           *__return_storage_ptr__,tessellation *this,int count,void *memory,int offset,int stride)

{
  size_type __n;
  reference dst;
  undefined4 in_register_00000014;
  int local_4c;
  void *pvStack_48;
  int i;
  deUint8 *pData;
  allocator<tcu::Vector<float,_3>_> local_2a;
  undefined1 local_29;
  int local_28;
  int local_24;
  int stride_local;
  int offset_local;
  void *memory_local;
  vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_> *pvStack_10;
  int count_local;
  vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_> *results;
  
  _stride_local = CONCAT44(in_register_00000014,count);
  memory_local._4_4_ = (int)this;
  local_24 = (int)memory;
  local_29 = 0;
  __n = (size_type)memory_local._4_4_;
  local_28 = offset;
  pvStack_10 = __return_storage_ptr__;
  std::allocator<tcu::Vector<float,_3>_>::allocator(&local_2a);
  std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>::vector
            (__return_storage_ptr__,__n,&local_2a);
  std::allocator<tcu::Vector<float,_3>_>::~allocator(&local_2a);
  pvStack_48 = (void *)(_stride_local + local_24);
  for (local_4c = 0; local_4c < memory_local._4_4_; local_4c = local_4c + 1) {
    dst = std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>::operator[]
                    (__return_storage_ptr__,(long)local_4c);
    ::deMemcpy(dst,pvStack_48,0xc);
    pvStack_48 = (void *)((long)pvStack_48 + (long)local_28);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<T> readInterleavedData (const int count, const void* memory, const int offset, const int stride)
{
	std::vector<T> results(count);
	const deUint8* pData = static_cast<const deUint8*>(memory) + offset;

	for (int i = 0; i < count; ++i)
	{
		deMemcpy(&results[i], pData, sizeof(T));
		pData += stride;
	}

	return results;
}